

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateManager.cpp
# Opt level: O0

void __thiscall
helics::MessageFederateManager::updateTime(MessageFederateManager *this,Time newTime,Time param_3)

{
  Message *pMVar1;
  bool bVar2;
  undefined1 uVar3;
  Message *in_RSI;
  TimeRepresentation<count_time<9,_long>_> in_RDI;
  EndpointData *eData;
  Endpoint *currentEpt;
  BlockIterator<helics::Endpoint,_32,_helics::Endpoint_**> fid;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> message;
  size_t ii;
  function<void_(helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)> mcall;
  handle epts;
  InterfaceHandle endpoint_id;
  uint64_t epCount;
  Endpoint *in_stack_fffffffffffffed8;
  DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>
  *in_stack_fffffffffffffee0;
  undefined7 in_stack_fffffffffffffee8;
  atomic_guarded<std::function<void_(helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::mutex>
  *in_stack_ffffffffffffff08;
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
  *in_stack_ffffffffffffff18;
  DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>
  *in_stack_ffffffffffffff20;
  BlockIterator<helics::Endpoint,_32,_helics::Endpoint_**> local_a0;
  int local_88;
  undefined4 local_84;
  undefined1 local_80 [8];
  ulong local_78;
  lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
  local_40;
  InterfaceHandle local_28;
  undefined4 local_24;
  ulong local_20;
  
  (((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
   (in_RDI.internalTimeCode + 0x158))->_M_t).
  super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
  super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
  super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl = in_RSI;
  pMVar1 = (((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
            (in_RDI.internalTimeCode + 0x160))->_M_t).
           super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
           super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
           super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
  local_24 = *(undefined4 *)
              &(((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                (in_RDI.internalTimeCode + 0x170))->_M_t).
               super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
               super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
               super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
  local_20 = (**(code **)((pMVar1->time).internalTimeCode + 0x290))(pMVar1,local_24);
  if (local_20 != 0) {
    InterfaceHandle::InterfaceHandle(&local_28);
    gmlc::libguarded::
    shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
    ::lock(in_stack_ffffffffffffff18);
    gmlc::libguarded::
    atomic_guarded<std::function<void_(helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::mutex>
    ::load(in_stack_ffffffffffffff08);
    for (local_78 = 0; local_78 < local_20; local_78 = local_78 + 1) {
      pMVar1 = (((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                (in_RDI.internalTimeCode + 0x160))->_M_t).
               super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
               super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
               super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
      local_84 = *(undefined4 *)
                  &(((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                    (in_RDI.internalTimeCode + 0x170))->_M_t).
                   super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
                   super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
      (**(code **)((pMVar1->time).internalTimeCode + 0x288))(local_80,pMVar1,local_84,&local_28);
      bVar2 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                         0x278c1e);
      if (bVar2) {
        gmlc::libguarded::
        lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
        ::operator->(&local_40);
        gmlc::containers::
        DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>
        ::find(in_stack_ffffffffffffff20,(InterfaceHandle *)in_stack_ffffffffffffff18);
        gmlc::libguarded::
        lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
        ::operator->(&local_40);
        gmlc::containers::
        DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>
        ::end(in_stack_fffffffffffffee0);
        uVar3 = gmlc::containers::BlockIterator<helics::Endpoint,32,helics::Endpoint**>::operator!=
                          ((BlockIterator<helics::Endpoint,_32,_helics::Endpoint_**> *)
                           in_stack_fffffffffffffee0,
                           (BlockIterator<const_helics::Endpoint,_32,_const_helics::Endpoint_*const_*>
                            *)in_stack_fffffffffffffed8);
        if ((bool)uVar3) {
          in_stack_fffffffffffffee0 =
               (DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>
                *)gmlc::containers::BlockIterator<helics::Endpoint,_32,_helics::Endpoint_**>::
                  operator*(&local_a0);
          in_stack_fffffffffffffed8 =
               gmlc::containers::BlockIterator<helics::Endpoint,_32,_helics::Endpoint_**>::
               operator->(&local_a0);
          gmlc::containers::
          SimpleQueue<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>,std::mutex>
          ::emplace<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>
                    ((SimpleQueue<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::mutex>
                      *)in_stack_ffffffffffffff20,
                     (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                     in_stack_ffffffffffffff18);
          bVar2 = std::function::operator_cast_to_bool
                            ((function<void_(helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)>
                              *)in_stack_fffffffffffffee0);
          if (bVar2) {
            gmlc::libguarded::
            lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
            ::unlock((lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
                      *)in_stack_fffffffffffffee0);
            std::function<void_(helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)>::
            operator()((function<void_(helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)>
                        *)CONCAT17(uVar3,in_stack_fffffffffffffee8),
                       (Endpoint *)in_stack_fffffffffffffee0,in_RDI);
            gmlc::libguarded::
            shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
            ::lock(in_stack_ffffffffffffff18);
            gmlc::libguarded::
            lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
            ::operator=((lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
                         *)in_stack_fffffffffffffee0,
                        (lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
                         *)in_stack_fffffffffffffed8);
            gmlc::libguarded::
            lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
            ::~lock_handle((lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
                            *)0x278da2);
          }
          else {
            bVar2 = std::function::operator_cast_to_bool
                              ((function<void_(helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)>
                                *)in_stack_fffffffffffffee0);
            if (bVar2) {
              gmlc::libguarded::
              lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
              ::unlock((lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
                        *)in_stack_fffffffffffffee0);
              std::function<void_(helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)>::
              operator()((function<void_(helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)>
                          *)CONCAT17(uVar3,in_stack_fffffffffffffee8),
                         (Endpoint *)in_stack_fffffffffffffee0,in_RDI);
              gmlc::libguarded::
              shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
              ::lock(in_stack_ffffffffffffff18);
              gmlc::libguarded::
              lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
              ::operator=((lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
                           *)in_stack_fffffffffffffee0,
                          (lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
                           *)in_stack_fffffffffffffed8);
              gmlc::libguarded::
              lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
              ::~lock_handle((lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
                              *)0x278e46);
            }
          }
        }
        local_88 = 0;
      }
      else {
        local_88 = 2;
      }
      std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                 in_RDI.internalTimeCode);
      if (local_88 != 0) break;
    }
    std::function<void_(helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)>::~function
              ((function<void_(helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)> *)
               0x278e99);
    gmlc::libguarded::
    lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
    ::~lock_handle((lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
                    *)0x278ea6);
  }
  return;
}

Assistant:

void MessageFederateManager::updateTime(Time newTime, Time /*oldTime*/)
{
    CurrentTime = newTime;
    auto epCount = coreObject->receiveCountAny(fedID);
    if (epCount == 0) {
        return;
    }
    InterfaceHandle endpoint_id;
    auto epts = mLocalEndpoints.lock();
    auto mcall = allCallback.load();
    for (size_t ii = 0; ii < epCount; ++ii) {
        auto message = coreObject->receiveAny(fedID, endpoint_id);
        if (!message) {
            break;
        }

        /** find the id*/
        auto fid = epts->find(endpoint_id);
        if (fid != epts->end()) {  // assign the data

            Endpoint& currentEpt = *fid;
            auto* eData = static_cast<EndpointData*>(fid->dataReference);

            eData->messages.emplace(std::move(message));

            if (eData->callback) {
                // need to be copied otherwise there is a potential race condition on lock removal
                epts.unlock();
                eData->callback(currentEpt, CurrentTime);
                epts = mLocalEndpoints.lock();
            } else if (mcall) {
                epts.unlock();
                mcall(currentEpt, CurrentTime);
                epts = mLocalEndpoints.lock();
            }
        }
    }
}